

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompress_template.h
# Opt level: O2

libdeflate_result
deflate_decompress_bmi2
          (libdeflate_decompressor *d,void *in,size_t in_nbytes,void *out,size_t out_nbytes_avail,
          size_t *actual_in_nbytes_ret,size_t *actual_out_nbytes_ret)

{
  long *plVar1;
  byte *pbVar2;
  u8 uVar3;
  undefined8 uVar4;
  sbyte sVar5;
  byte *pbVar6;
  _Bool _Var7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  byte *pbVar11;
  long *plVar12;
  uint num_offset_syms;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  byte *pbVar16;
  ushort *puVar17;
  byte bVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  long *__dest;
  long *plVar29;
  bool bVar30;
  libdeflate_result local_9c;
  ulong local_98;
  byte local_90;
  ulong local_70;
  
  plVar1 = (long *)((long)out + out_nbytes_avail);
  sVar8 = 299;
  if (out_nbytes_avail < 299) {
    sVar8 = out_nbytes_avail;
  }
  pbVar2 = (byte *)((long)in + in_nbytes);
  sVar9 = 0x19;
  if (in_nbytes < 0x19) {
    sVar9 = in_nbytes;
  }
  local_9c = LIBDEFLATE_BAD_DATA;
  local_98 = 0;
  uVar15 = 0;
  uVar21 = 0;
  pbVar16 = (byte *)in;
  __dest = (long *)out;
  do {
    if ((ulong)((long)pbVar2 - (long)pbVar16) < 8) {
      while (uVar14 = (uint)uVar15, (uVar14 & 0xff) < 0x38) {
        if (pbVar16 == pbVar2) {
          local_98 = local_98 + 1;
          if (8 < local_98) {
            return LIBDEFLATE_BAD_DATA;
          }
        }
        else {
          bVar18 = *pbVar16;
          pbVar16 = pbVar16 + 1;
          uVar21 = uVar21 | (ulong)bVar18 << (uVar15 & 0x3f);
        }
        uVar15 = (ulong)(uVar14 + 8);
      }
      uVar10 = uVar21 & 0xffffffff;
      local_70 = uVar21;
      switch((uint)(uVar21 >> 1) & 3) {
      case 0:
switchD_00109707_caseD_0:
        uVar21 = (ulong)(uVar14 + 0xfd >> 3 & 0x1f);
        lVar22 = local_98 - uVar21;
        if (uVar21 <= local_98 && lVar22 != 0) {
          return LIBDEFLATE_BAD_DATA;
        }
        puVar17 = (ushort *)(pbVar16 + lVar22);
        if ((long)pbVar2 - (long)puVar17 < 4) {
          return LIBDEFLATE_BAD_DATA;
        }
        uVar21 = (ulong)*puVar17;
        if ((puVar17[1] ^ *puVar17) != 0xffff) {
          return LIBDEFLATE_BAD_DATA;
        }
        if ((long)plVar1 - (long)__dest < (long)uVar21) {
          return LIBDEFLATE_INSUFFICIENT_SPACE;
        }
        puVar17 = puVar17 + 2;
        if ((long)pbVar2 - (long)puVar17 < (long)uVar21) {
          return LIBDEFLATE_BAD_DATA;
        }
        memcpy(__dest,puVar17,uVar21);
        pbVar16 = (byte *)((long)puVar17 + uVar21);
        __dest = (long *)((long)__dest + uVar21);
        local_98 = 0;
        uVar15 = 0;
        uVar21 = 0;
        break;
      case 1:
        goto switchD_00109707_caseD_1;
      case 2:
        goto switchD_00109707_caseD_2;
      case 3:
        goto switchD_00109707_caseD_3;
      }
    }
    else {
      uVar10 = *(long *)pbVar16 << (uVar15 & 0x3f) | uVar21;
      pbVar16 = pbVar16 + (7 - (ulong)((uint)(uVar15 >> 3) & 7));
      uVar14 = (uint)uVar15 | 0x38;
      uVar21 = uVar10;
      local_70 = uVar10;
      switch((uint)(uVar10 >> 1) & 3) {
      case 0:
        goto switchD_00109707_caseD_0;
      case 1:
switchD_00109707_caseD_1:
        uVar26 = uVar21 >> 3;
        uVar15 = (ulong)(uVar14 - 3);
        local_70 = uVar21;
        if (d->static_codes_loaded == false) {
          d->static_codes_loaded = true;
          for (lVar22 = 0; lVar22 != 0x90; lVar22 = lVar22 + 1) {
            (d->u).precode_lens[lVar22] = '\b';
          }
          for (lVar22 = -0x70; lVar22 != 0; lVar22 = lVar22 + 1) {
            (d->u).precode_lens[lVar22 + 0x100] = '\t';
          }
          for (lVar22 = -0x18; lVar22 != 0; lVar22 = lVar22 + 1) {
            (d->u).precode_lens[lVar22 + 0x118] = '\a';
          }
          for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
            (d->u).precode_lens[lVar22 + 0x118] = '\b';
          }
          for (lVar22 = 0; lVar22 != 0x20; lVar22 = lVar22 + 1) {
            (d->u).precode_lens[lVar22 + 0x120] = '\x05';
          }
          uVar27 = 0x120;
          uVar28 = 0x20;
          goto LAB_00109b73;
        }
        break;
      case 2:
switchD_00109707_caseD_2:
        d->static_codes_loaded = false;
        (d->u).precode_lens[0x10] = (byte)(uVar21 >> 0x11) & 7;
        uVar26 = uVar21 >> 0x14;
        uVar14 = uVar14 - 0x14;
        uVar15 = (ulong)uVar14;
        if ((ulong)((long)pbVar2 - (long)pbVar16) < 8) {
          for (; ((uint)uVar15 & 0xff) < 0x38; uVar15 = (ulong)((uint)uVar15 + 8)) {
            if (pbVar16 == pbVar2) {
              local_98 = local_98 + 1;
              if (8 < local_98) {
                return LIBDEFLATE_BAD_DATA;
              }
            }
            else {
              bVar18 = *pbVar16;
              pbVar16 = pbVar16 + 1;
              uVar26 = uVar26 | (ulong)bVar18 << (uVar15 & 0x3f);
            }
          }
        }
        else {
          uVar26 = uVar26 | *(long *)pbVar16 << (uVar15 & 0x3f);
          pbVar16 = pbVar16 + (7 - (ulong)(uVar14 >> 3 & 7));
          uVar15 = (ulong)(uVar14 | 0x38);
        }
        uVar27 = ((uint)(uVar10 >> 3) & 0x1f) + 0x101;
        uVar28 = ((uint)(uVar10 >> 8) & 0x1f) + 1;
        uVar14 = (uint)uVar10 >> 0xd & 0xf;
        lVar22 = 1;
        pbVar6 = "\x12";
        do {
          pbVar11 = pbVar6;
          (d->u).precode_lens["\x10\x11\x12"[lVar22]] = (byte)uVar26 & 7;
          uVar26 = uVar26 >> 3;
          uVar15 = (ulong)((int)uVar15 - 3);
          lVar23 = (-3 - (ulong)uVar14) + lVar22;
          lVar22 = lVar22 + 1;
          pbVar6 = pbVar11 + 1;
        } while (lVar23 != 0);
        lVar22 = (ulong)(0x11 - uVar14) - 2;
        while (bVar30 = lVar22 != 0, lVar22 = lVar22 + -1, bVar30) {
          (d->u).precode_lens[*pbVar11] = '\0';
          pbVar11 = pbVar11 + 1;
        }
        _Var7 = build_precode_decode_table(d);
        if (!_Var7) {
          return LIBDEFLATE_BAD_DATA;
        }
        uVar10 = 0;
        do {
          uVar14 = (uint)uVar15;
          if ((uVar14 & 0xff) < 0xe) {
            if ((ulong)((long)pbVar2 - (long)pbVar16) < 8) {
              while (uVar14 = (uint)uVar15, (uVar14 & 0xff) < 0x38) {
                if (pbVar16 == pbVar2) {
                  local_98 = local_98 + 1;
                  if (8 < local_98) {
                    return LIBDEFLATE_BAD_DATA;
                  }
                }
                else {
                  bVar18 = *pbVar16;
                  pbVar16 = pbVar16 + 1;
                  uVar26 = uVar26 | (ulong)bVar18 << (uVar15 & 0x3f);
                }
                uVar15 = (ulong)(uVar14 + 8);
              }
            }
            else {
              uVar26 = uVar26 | *(long *)pbVar16 << (uVar15 & 0x3f);
              pbVar16 = pbVar16 + (7 - (ulong)((uint)(uVar15 >> 3) & 7));
              uVar14 = uVar14 | 0x38;
            }
          }
          uVar25 = *(uint *)((long)&d->u + (ulong)((uint)uVar26 & 0x7f) * 4 + 0x1cc);
          uVar26 = uVar26 >> ((ulong)uVar25 & 0x3f);
          uVar14 = uVar14 - uVar25;
          iVar19 = (int)uVar10;
          if (uVar25 < 0x100000) {
            uVar20 = iVar19 + 1;
            (d->u).precode_lens[uVar10] = (u8)(uVar25 >> 0x10);
          }
          else {
            uVar20 = (uint)uVar26;
            if (uVar25 >> 0x10 == 0x11) {
              uVar20 = (uVar20 & 7) + 3;
              uVar26 = uVar26 >> 3;
              uVar14 = uVar14 - 3;
              (d->u).precode_lens[uVar10] = '\0';
              (d->u).precode_lens[iVar19 + 1] = '\0';
              (d->u).precode_lens[iVar19 + 2] = '\0';
              (d->u).precode_lens[iVar19 + 3] = '\0';
              (d->u).precode_lens[iVar19 + 4] = '\0';
              (d->u).precode_lens[iVar19 + 5] = '\0';
              (d->u).precode_lens[iVar19 + 6] = '\0';
              (d->u).precode_lens[iVar19 + 7] = '\0';
              (d->u).precode_lens[iVar19 + 8] = '\0';
              (d->u).precode_lens[iVar19 + 9] = '\0';
            }
            else if (uVar25 >> 0x10 == 0x10) {
              if (iVar19 == 0) {
                return LIBDEFLATE_BAD_DATA;
              }
              uVar3 = (d->u).precode_lens[iVar19 - 1];
              uVar20 = (uVar20 & 3) + 3;
              uVar26 = uVar26 >> 2;
              uVar14 = uVar14 - 2;
              (d->u).precode_lens[uVar10] = uVar3;
              (d->u).precode_lens[iVar19 + 1] = uVar3;
              (d->u).precode_lens[iVar19 + 2] = uVar3;
              (d->u).precode_lens[iVar19 + 3] = uVar3;
              (d->u).precode_lens[iVar19 + 4] = uVar3;
              (d->u).precode_lens[iVar19 + 5] = uVar3;
            }
            else {
              uVar20 = (uVar20 & 0x7f) + 0xb;
              uVar26 = uVar26 >> 7;
              uVar14 = uVar14 - 7;
              memset((void *)((long)&d->u + uVar10),0,(ulong)uVar20);
            }
            uVar20 = uVar20 + iVar19;
          }
          uVar15 = (ulong)uVar14;
          uVar10 = (ulong)uVar20;
        } while (uVar20 < uVar27 + uVar28);
        local_70 = uVar21;
        if (uVar20 != uVar27 + uVar28) {
          return LIBDEFLATE_BAD_DATA;
        }
LAB_00109b73:
        _Var7 = build_offset_decode_table(d,uVar27,uVar28);
        if (!_Var7) {
          return LIBDEFLATE_BAD_DATA;
        }
        _Var7 = build_litlen_decode_table(d,uVar27,num_offset_syms);
        if (!_Var7) {
          return LIBDEFLATE_BAD_DATA;
        }
        break;
      case 3:
        goto switchD_00109707_caseD_3;
      }
      uVar10 = ~(-1L << ((ulong)(byte)d->litlen_tablebits & 0x3f));
      if ((pbVar16 < pbVar2 + -sVar9) && (__dest < (long *)((long)plVar1 - sVar8))) {
        uVar26 = uVar26 | *(long *)pbVar16 << (uVar15 & 0x3f);
        pbVar16 = pbVar16 + (7 - (ulong)((uint)(uVar15 >> 3) & 7));
        uVar15 = (ulong)((uint)uVar15 | 0x38);
        uVar14 = (d->u).litlen_decode_table[uVar26 & uVar10];
        do {
          uVar13 = (ulong)uVar14;
          uVar21 = uVar26 >> (uVar13 & 0x3f);
          uVar28 = (int)uVar15 - uVar14;
          uVar15 = (ulong)uVar28;
          uVar24 = uVar21;
          if ((int)uVar14 < 0) {
            *(char *)__dest = (char)(uVar14 >> 0x10);
            uVar14 = (d->u).litlen_decode_table[uVar21 & uVar10];
            uVar13 = (ulong)uVar14;
            uVar26 = uVar21 >> (uVar13 & 0x3f);
            uVar28 = uVar28 - uVar14;
            uVar15 = (ulong)uVar28;
            if (-1 < (int)uVar14) {
              __dest = (long *)((long)__dest + 1);
              uVar24 = uVar26;
              uVar26 = uVar21;
              goto LAB_00109c32;
            }
            *(char *)((long)__dest + 1) = (char)(uVar14 >> 0x10);
            uVar14 = (d->u).litlen_decode_table[uVar26 & uVar10];
            uVar13 = (ulong)uVar14;
            uVar24 = uVar26 >> (uVar13 & 0x3f);
            uVar28 = uVar28 - uVar14;
            uVar15 = (ulong)uVar28;
            if (-1 < (int)uVar14) {
              __dest = (long *)((long)__dest + 2);
              goto LAB_00109c32;
            }
            *(char *)((long)__dest + 2) = (char)(uVar14 >> 0x10);
            uVar14 = (d->u).litlen_decode_table[uVar24 & uVar10];
            uVar26 = *(long *)pbVar16 << (uVar15 & 0x3f) | uVar24;
            plVar12 = (long *)((long)__dest + 3);
LAB_00109e37:
            lVar22 = (long)pbVar16 - (ulong)(uVar28 >> 3 & 7);
          }
          else {
LAB_00109c32:
            uVar14 = (uint)uVar13;
            uVar21 = uVar24;
            if ((short)uVar13 < 0) {
              if ((uVar14 >> 0xd & 1) != 0) goto LAB_001097a1;
              bVar18 = (byte)(uVar13 >> 8) & 0x1f;
              sVar5 = (bVar18 < 0x21) * (' ' - bVar18);
              uVar14 = (d->u).litlen_decode_table
                       [(ulong)((uint)((int)uVar24 << sVar5) >> sVar5) + (uVar13 >> 0x10)];
              uVar21 = uVar24 >> ((ulong)uVar14 & 0x3f);
              uVar28 = (int)uVar15 - uVar14;
              uVar15 = (ulong)uVar28;
              if ((int)uVar14 < 0) {
                *(char *)__dest = (char)(uVar14 >> 0x10);
                uVar14 = (d->u).litlen_decode_table[uVar21 & uVar10];
                uVar26 = *(long *)pbVar16 << (uVar15 & 0x3f) | uVar21;
                plVar12 = (long *)((long)__dest + 1);
                goto LAB_00109e37;
              }
              if ((uVar14 >> 0xd & 1) != 0) goto LAB_001097a1;
              local_90 = (byte)uVar14;
            }
            else {
              local_90 = (byte)uVar13;
              uVar24 = uVar26;
            }
            uVar27 = d->offset_decode_table[(uint)uVar21 & 0xff];
            uVar28 = (uint)uVar15;
            uVar25 = uVar28 & 0xff;
            if ((short)uVar27 < 0) {
              if (uVar25 < 0x26) {
                uVar21 = uVar21 | *(long *)pbVar16 << ((ulong)uVar25 & 0x3f);
                pbVar16 = pbVar16 + (7 - (ulong)((uint)(uVar15 >> 3) & 7));
                uVar28 = uVar28 | 0x38;
              }
              uVar21 = uVar21 >> 8;
              uVar28 = uVar28 - 8;
              bVar18 = (byte)(uVar27 >> 8) & 0x3f;
              sVar5 = (bVar18 < 0x41) * ('@' - bVar18);
              uVar27 = d->offset_decode_table
                       [((uVar21 << sVar5) >> sVar5) + (ulong)(uVar27 >> 0x10)];
            }
            else if (uVar25 < 0x1f) {
              uVar21 = uVar21 | *(long *)pbVar16 << ((ulong)uVar25 & 0x3f);
              pbVar16 = pbVar16 + (7 - (ulong)((uint)(uVar15 >> 3) & 7));
              uVar28 = uVar28 | 0x38;
            }
            sVar5 = ((byte)uVar27 < 0x41) * ('@' - (byte)uVar27);
            uVar25 = (int)(((uVar21 << sVar5) >> sVar5) >> ((ulong)(uVar27 >> 8) & 0x3f)) +
                     (uVar27 >> 0x10);
            uVar15 = (ulong)uVar25;
            if ((long)__dest - (long)out < (long)uVar15) {
              return LIBDEFLATE_BAD_DATA;
            }
            sVar5 = (local_90 < 0x41) * ('@' - local_90);
            uVar28 = uVar28 - uVar27;
            uVar21 = uVar21 >> ((ulong)(uVar27 & 0xff) & 0x3f);
            lVar23 = -uVar15;
            plVar12 = (long *)((ulong)((int)(((uVar24 << sVar5) >> sVar5) >>
                                            ((ulong)(uVar14 >> 8) & 0x3f)) + (uVar14 >> 0x10)) +
                              (long)__dest);
            uVar26 = *(long *)pbVar16 << ((ulong)uVar28 & 0x3f) | uVar21;
            uVar14 = (d->u).litlen_decode_table[uVar21 & uVar10];
            lVar22 = (long)pbVar16 - (ulong)(uVar28 >> 3 & 7);
            if (uVar25 < 8) {
              if (uVar25 == 1) {
                lVar23 = (ulong)*(byte *)((long)__dest + lVar23) * 0x101010101010101;
                do {
                  *__dest = lVar23;
                  __dest[1] = lVar23;
                  __dest[2] = lVar23;
                  __dest[3] = lVar23;
                  __dest = __dest + 4;
                } while (__dest < plVar12);
              }
              else {
                lVar23 = *(long *)((long)__dest + lVar23);
                *__dest = lVar23;
                *(long *)((long)__dest + uVar15) = lVar23;
                do {
                  uVar4 = *(undefined8 *)((long)__dest + uVar15);
                  *(undefined8 *)((long)__dest + uVar15 * 2) = uVar4;
                  *(undefined8 *)((long)__dest + uVar15 * 3) = uVar4;
                  __dest = (long *)((long)__dest + uVar15 * 2);
                } while ((long *)((long)__dest + uVar15 * 2) < plVar12);
              }
            }
            else {
              *__dest = *(long *)((long)__dest + lVar23);
              __dest[1] = *(long *)((long)__dest + lVar23 + 8);
              __dest[2] = *(long *)((long)__dest + lVar23 + 0x10);
              __dest[3] = *(long *)((long)__dest + lVar23 + 0x18);
              while( true ) {
                __dest[4] = *(long *)((long)(__dest + 4) + lVar23);
                if (plVar12 <= __dest + 5) break;
                __dest[5] = *(long *)((long)__dest + lVar23 + 0x28);
                __dest[6] = *(long *)((long)__dest + lVar23 + 0x30);
                __dest[7] = *(long *)((long)__dest + lVar23 + 0x38);
                __dest[8] = *(long *)((long)__dest + lVar23 + 0x40);
                __dest = __dest + 5;
              }
            }
          }
          pbVar16 = (byte *)(lVar22 + 7);
          uVar15 = (ulong)(uVar28 | 0x38);
          __dest = plVar12;
        } while ((pbVar16 < pbVar2 + -sVar9) && (plVar12 < (long *)((long)plVar1 - sVar8)));
      }
      while( true ) {
        while( true ) {
          if ((ulong)((long)pbVar2 - (long)pbVar16) < 8) {
            while (uVar14 = (uint)uVar15, uVar24 = uVar26, (uVar14 & 0xff) < 0x38) {
              if (pbVar16 == pbVar2) {
                local_98 = local_98 + 1;
                if (8 < local_98) {
                  return LIBDEFLATE_BAD_DATA;
                }
              }
              else {
                bVar18 = *pbVar16;
                pbVar16 = pbVar16 + 1;
                uVar26 = uVar26 | (ulong)bVar18 << (uVar15 & 0x3f);
              }
              uVar15 = (ulong)(uVar14 + 8);
            }
          }
          else {
            lVar22 = *(long *)pbVar16;
            pbVar16 = pbVar16 + (7 - (ulong)((uint)(uVar15 >> 3) & 7));
            uVar14 = (uint)uVar15 | 0x38;
            uVar24 = uVar26 | lVar22 << (uVar15 & 0x3f);
          }
          uVar28 = (d->u).litlen_decode_table[uVar24 & uVar10];
          uVar13 = (ulong)uVar28;
          uVar21 = uVar24 >> (uVar13 & 0x3f);
          uVar14 = uVar14 - uVar28;
          uVar26 = uVar21;
          if ((uVar28 >> 0xe & 1) != 0) {
            bVar18 = (byte)(uVar28 >> 8) & 0x3f;
            sVar5 = (bVar18 < 0x41) * ('@' - bVar18);
            uVar13 = (ulong)(d->u).litlen_decode_table
                            [((uVar21 << sVar5) >> sVar5) + (ulong)(uVar28 >> 0x10)];
            uVar14 = uVar14 - (d->u).litlen_decode_table
                              [((uVar21 << sVar5) >> sVar5) + (ulong)(uVar28 >> 0x10)];
            uVar26 = uVar21 >> (uVar13 & 0x3f);
            uVar24 = uVar21;
          }
          uVar15 = (ulong)uVar14;
          if (-1 < (int)(uint)uVar13) break;
          if (__dest == plVar1) {
            return LIBDEFLATE_INSUFFICIENT_SPACE;
          }
          *(char *)__dest = (char)(uVar13 >> 0x10);
          __dest = (long *)((long)__dest + 1);
        }
        uVar21 = uVar26;
        if (((uint)uVar13 >> 0xd & 1) != 0) break;
        sVar5 = ((byte)uVar13 < 0x41) * ('@' - (byte)uVar13);
        uVar21 = (ulong)(uint)((int)(uVar13 >> 0x10) +
                              (int)(((uVar24 << sVar5) >> sVar5) >>
                                   ((ulong)((byte)(uVar13 >> 8) & 0xdf) & 0x3f)));
        if ((long)plVar1 - (long)__dest < (long)uVar21) {
          return LIBDEFLATE_INSUFFICIENT_SPACE;
        }
        uVar28 = d->offset_decode_table[uVar26 & 0xff];
        if ((short)uVar28 < 0) {
          uVar26 = uVar26 >> 8;
          uVar14 = uVar14 - 8;
          bVar18 = (byte)(uVar28 >> 8) & 0x3f;
          sVar5 = (bVar18 < 0x41) * ('@' - bVar18);
          uVar28 = d->offset_decode_table[((uVar26 << sVar5) >> sVar5) + (ulong)(uVar28 >> 0x10)];
        }
        sVar5 = ((byte)uVar28 < 0x41) * ('@' - (byte)uVar28);
        uVar24 = (ulong)((int)(((uVar26 << sVar5) >> sVar5) >> ((ulong)(uVar28 >> 8) & 0x3f)) +
                        (uVar28 >> 0x10));
        if ((long)__dest - (long)out < (long)uVar24) {
          return LIBDEFLATE_BAD_DATA;
        }
        uVar26 = uVar26 >> ((ulong)uVar28 & 0x3f);
        uVar15 = (ulong)(uVar14 - uVar28);
        plVar12 = (long *)(uVar21 + (long)__dest);
        *(undefined1 *)__dest = *(undefined1 *)((long)__dest - uVar24);
        *(undefined1 *)((long)__dest + 1) = ((undefined1 *)((long)__dest - uVar24))[1];
        plVar29 = (long *)((long)__dest + 2);
        do {
          *(undefined1 *)plVar29 = *(undefined1 *)((long)plVar29 - uVar24);
          plVar29 = (long *)((long)plVar29 + 1);
          __dest = plVar12;
        } while (plVar29 < plVar12);
      }
    }
LAB_001097a1:
  } while ((local_70 & 1) == 0);
  uVar21 = (ulong)((uint)(uVar15 >> 3) & 0x1f);
  lVar22 = local_98 - uVar21;
  if (local_98 < uVar21 || lVar22 == 0) {
    if (actual_in_nbytes_ret != (size_t *)0x0) {
      *actual_in_nbytes_ret = (size_t)(pbVar16 + (lVar22 - (long)in));
    }
    if (actual_out_nbytes_ret == (size_t *)0x0) {
      if (__dest != plVar1) {
        return LIBDEFLATE_SHORT_OUTPUT;
      }
    }
    else {
      *actual_out_nbytes_ret = (long)__dest - (long)out;
    }
    local_9c = LIBDEFLATE_SUCCESS;
  }
switchD_00109707_caseD_3:
  return local_9c;
}

Assistant:

static ATTRIBUTES MAYBE_UNUSED enum libdeflate_result
FUNCNAME(struct libdeflate_decompressor * restrict d,
	 const void * restrict in, size_t in_nbytes,
	 void * restrict out, size_t out_nbytes_avail,
	 size_t *actual_in_nbytes_ret, size_t *actual_out_nbytes_ret)
{
	u8 *out_next = out;
	u8 * const out_end = out_next + out_nbytes_avail;
	u8 * const out_fastloop_end =
		out_end - MIN(out_nbytes_avail, FASTLOOP_MAX_BYTES_WRITTEN);

	/* Input bitstream state; see deflate_decompress.c for documentation */
	const u8 *in_next = in;
	const u8 * const in_end = in_next + in_nbytes;
	const u8 * const in_fastloop_end =
		in_end - MIN(in_nbytes, FASTLOOP_MAX_BYTES_READ);
	bitbuf_t bitbuf = 0;
	bitbuf_t saved_bitbuf;
	u32 bitsleft = 0;
	size_t overread_count = 0;

	bool is_final_block;
	unsigned block_type;
	unsigned num_litlen_syms;
	unsigned num_offset_syms;
	bitbuf_t litlen_tablemask;
	u32 entry;

next_block:
	/* Starting to read the next block */
	;

	STATIC_ASSERT(CAN_CONSUME(1 + 2 + 5 + 5 + 4 + 3));
	REFILL_BITS();

	/* BFINAL: 1 bit */
	is_final_block = bitbuf & BITMASK(1);

	/* BTYPE: 2 bits */
	block_type = (bitbuf >> 1) & BITMASK(2);

	if (block_type == DEFLATE_BLOCKTYPE_DYNAMIC_HUFFMAN) {

		/* Dynamic Huffman block */

		/* The order in which precode lengths are stored */
		static const u8 deflate_precode_lens_permutation[DEFLATE_NUM_PRECODE_SYMS] = {
			16, 17, 18, 0, 8, 7, 9, 6, 10, 5, 11, 4, 12, 3, 13, 2, 14, 1, 15
		};

		unsigned num_explicit_precode_lens;
		unsigned i;

		/* Read the codeword length counts. */

		STATIC_ASSERT(DEFLATE_NUM_LITLEN_SYMS == 257 + BITMASK(5));
		num_litlen_syms = 257 + ((bitbuf >> 3) & BITMASK(5));

		STATIC_ASSERT(DEFLATE_NUM_OFFSET_SYMS == 1 + BITMASK(5));
		num_offset_syms = 1 + ((bitbuf >> 8) & BITMASK(5));

		STATIC_ASSERT(DEFLATE_NUM_PRECODE_SYMS == 4 + BITMASK(4));
		num_explicit_precode_lens = 4 + ((bitbuf >> 13) & BITMASK(4));

		d->static_codes_loaded = false;

		/*
		 * Read the precode codeword lengths.
		 *
		 * A 64-bit bitbuffer is just one bit too small to hold the
		 * maximum number of precode lens, so to minimize branches we
		 * merge one len with the previous fields.
		 */
		STATIC_ASSERT(DEFLATE_MAX_PRE_CODEWORD_LEN == (1 << 3) - 1);
		if (CAN_CONSUME(3 * (DEFLATE_NUM_PRECODE_SYMS - 1))) {
			d->u.precode_lens[deflate_precode_lens_permutation[0]] =
				(bitbuf >> 17) & BITMASK(3);
			bitbuf >>= 20;
			bitsleft -= 20;
			REFILL_BITS();
			i = 1;
			do {
				d->u.precode_lens[deflate_precode_lens_permutation[i]] =
					bitbuf & BITMASK(3);
				bitbuf >>= 3;
				bitsleft -= 3;
			} while (++i < num_explicit_precode_lens);
		} else {
			bitbuf >>= 17;
			bitsleft -= 17;
			i = 0;
			do {
				if ((u8)bitsleft < 3)
					REFILL_BITS();
				d->u.precode_lens[deflate_precode_lens_permutation[i]] =
					bitbuf & BITMASK(3);
				bitbuf >>= 3;
				bitsleft -= 3;
			} while (++i < num_explicit_precode_lens);
		}
		for (; i < DEFLATE_NUM_PRECODE_SYMS; i++)
			d->u.precode_lens[deflate_precode_lens_permutation[i]] = 0;

		/* Build the decode table for the precode. */
		SAFETY_CHECK(build_precode_decode_table(d));

		/* Decode the litlen and offset codeword lengths. */
		i = 0;
		do {
			unsigned presym;
			u8 rep_val;
			unsigned rep_count;

			if ((u8)bitsleft < DEFLATE_MAX_PRE_CODEWORD_LEN + 7)
				REFILL_BITS();

			/*
			 * The code below assumes that the precode decode table
			 * doesn't have any subtables.
			 */
			STATIC_ASSERT(PRECODE_TABLEBITS == DEFLATE_MAX_PRE_CODEWORD_LEN);

			/* Decode the next precode symbol. */
			entry = d->u.l.precode_decode_table[
				bitbuf & BITMASK(DEFLATE_MAX_PRE_CODEWORD_LEN)];
			bitbuf >>= (u8)entry;
			bitsleft -= entry; /* optimization: subtract full entry */
			presym = entry >> 16;

			if (presym < 16) {
				/* Explicit codeword length */
				d->u.l.lens[i++] = presym;
				continue;
			}

			/* Run-length encoded codeword lengths */

			/*
			 * Note: we don't need to immediately verify that the
			 * repeat count doesn't overflow the number of elements,
			 * since we've sized the lens array to have enough extra
			 * space to allow for the worst-case overrun (138 zeroes
			 * when only 1 length was remaining).
			 *
			 * In the case of the small repeat counts (presyms 16
			 * and 17), it is fastest to always write the maximum
			 * number of entries.  That gets rid of branches that
			 * would otherwise be required.
			 *
			 * It is not just because of the numerical order that
			 * our checks go in the order 'presym < 16', 'presym ==
			 * 16', and 'presym == 17'.  For typical data this is
			 * ordered from most frequent to least frequent case.
			 */
			STATIC_ASSERT(DEFLATE_MAX_LENS_OVERRUN == 138 - 1);

			if (presym == 16) {
				/* Repeat the previous length 3 - 6 times. */
				SAFETY_CHECK(i != 0);
				rep_val = d->u.l.lens[i - 1];
				STATIC_ASSERT(3 + BITMASK(2) == 6);
				rep_count = 3 + (bitbuf & BITMASK(2));
				bitbuf >>= 2;
				bitsleft -= 2;
				d->u.l.lens[i + 0] = rep_val;
				d->u.l.lens[i + 1] = rep_val;
				d->u.l.lens[i + 2] = rep_val;
				d->u.l.lens[i + 3] = rep_val;
				d->u.l.lens[i + 4] = rep_val;
				d->u.l.lens[i + 5] = rep_val;
				i += rep_count;
			} else if (presym == 17) {
				/* Repeat zero 3 - 10 times. */
				STATIC_ASSERT(3 + BITMASK(3) == 10);
				rep_count = 3 + (bitbuf & BITMASK(3));
				bitbuf >>= 3;
				bitsleft -= 3;
				d->u.l.lens[i + 0] = 0;
				d->u.l.lens[i + 1] = 0;
				d->u.l.lens[i + 2] = 0;
				d->u.l.lens[i + 3] = 0;
				d->u.l.lens[i + 4] = 0;
				d->u.l.lens[i + 5] = 0;
				d->u.l.lens[i + 6] = 0;
				d->u.l.lens[i + 7] = 0;
				d->u.l.lens[i + 8] = 0;
				d->u.l.lens[i + 9] = 0;
				i += rep_count;
			} else {
				/* Repeat zero 11 - 138 times. */
				STATIC_ASSERT(11 + BITMASK(7) == 138);
				rep_count = 11 + (bitbuf & BITMASK(7));
				bitbuf >>= 7;
				bitsleft -= 7;
				memset(&d->u.l.lens[i], 0,
				       rep_count * sizeof(d->u.l.lens[i]));
				i += rep_count;
			}
		} while (i < num_litlen_syms + num_offset_syms);

		/* Unnecessary, but check this for consistency with zlib. */
		SAFETY_CHECK(i == num_litlen_syms + num_offset_syms);

	} else if (block_type == DEFLATE_BLOCKTYPE_UNCOMPRESSED) {
		u16 len, nlen;

		/*
		 * Uncompressed block: copy 'len' bytes literally from the input
		 * buffer to the output buffer.
		 */

		bitsleft -= 3; /* for BTYPE and BFINAL */

		/*
		 * Align the bitstream to the next byte boundary.  This means
		 * the next byte boundary as if we were reading a byte at a
		 * time.  Therefore, we have to rewind 'in_next' by any bytes
		 * that have been refilled but not actually consumed yet (not
		 * counting overread bytes, which don't increment 'in_next').
		 */
		bitsleft = (u8)bitsleft;
		SAFETY_CHECK(overread_count <= (bitsleft >> 3));
		in_next -= (bitsleft >> 3) - overread_count;
		overread_count = 0;
		bitbuf = 0;
		bitsleft = 0;

		SAFETY_CHECK(in_end - in_next >= 4);
		len = get_unaligned_le16(in_next);
		nlen = get_unaligned_le16(in_next + 2);
		in_next += 4;

		SAFETY_CHECK(len == (u16)~nlen);
		if (unlikely(len > out_end - out_next))
			return LIBDEFLATE_INSUFFICIENT_SPACE;
		SAFETY_CHECK(len <= in_end - in_next);

		memcpy(out_next, in_next, len);
		in_next += len;
		out_next += len;

		goto block_done;

	} else {
		unsigned i;

		SAFETY_CHECK(block_type == DEFLATE_BLOCKTYPE_STATIC_HUFFMAN);

		/*
		 * Static Huffman block: build the decode tables for the static
		 * codes.  Skip doing so if the tables are already set up from
		 * an earlier static block; this speeds up decompression of
		 * degenerate input of many empty or very short static blocks.
		 *
		 * Afterwards, the remainder is the same as decompressing a
		 * dynamic Huffman block.
		 */

		bitbuf >>= 3; /* for BTYPE and BFINAL */
		bitsleft -= 3;

		if (d->static_codes_loaded)
			goto have_decode_tables;

		d->static_codes_loaded = true;

		STATIC_ASSERT(DEFLATE_NUM_LITLEN_SYMS == 288);
		STATIC_ASSERT(DEFLATE_NUM_OFFSET_SYMS == 32);

		for (i = 0; i < 144; i++)
			d->u.l.lens[i] = 8;
		for (; i < 256; i++)
			d->u.l.lens[i] = 9;
		for (; i < 280; i++)
			d->u.l.lens[i] = 7;
		for (; i < 288; i++)
			d->u.l.lens[i] = 8;

		for (; i < 288 + 32; i++)
			d->u.l.lens[i] = 5;

		num_litlen_syms = 288;
		num_offset_syms = 32;
	}

	/* Decompressing a Huffman block (either dynamic or static) */

	SAFETY_CHECK(build_offset_decode_table(d, num_litlen_syms, num_offset_syms));
	SAFETY_CHECK(build_litlen_decode_table(d, num_litlen_syms, num_offset_syms));
have_decode_tables:
	litlen_tablemask = BITMASK(d->litlen_tablebits);

	/*
	 * This is the "fastloop" for decoding literals and matches.  It does
	 * bounds checks on in_next and out_next in the loop conditions so that
	 * additional bounds checks aren't needed inside the loop body.
	 *
	 * To reduce latency, the bitbuffer is refilled and the next litlen
	 * decode table entry is preloaded before each loop iteration.
	 */
	if (in_next >= in_fastloop_end || out_next >= out_fastloop_end)
		goto generic_loop;
	REFILL_BITS_IN_FASTLOOP();
	entry = d->u.litlen_decode_table[bitbuf & litlen_tablemask];
	do {
		u32 length, offset, lit;
		const u8 *src;
		u8 *dst;

		/*
		 * Consume the bits for the litlen decode table entry.  Save the
		 * original bitbuf for later, in case the extra match length
		 * bits need to be extracted from it.
		 */
		saved_bitbuf = bitbuf;
		bitbuf >>= (u8)entry;
		bitsleft -= entry; /* optimization: subtract full entry */

		/*
		 * Begin by checking for a "fast" literal, i.e. a literal that
		 * doesn't need a subtable.
		 */
		if (entry & HUFFDEC_LITERAL) {
			/*
			 * On 64-bit platforms, we decode up to 2 extra fast
			 * literals in addition to the primary item, as this
			 * increases performance and still leaves enough bits
			 * remaining for what follows.  We could actually do 3,
			 * assuming LITLEN_TABLEBITS=11, but that actually
			 * decreases performance slightly (perhaps by messing
			 * with the branch prediction of the conditional refill
			 * that happens later while decoding the match offset).
			 *
			 * Note: the definitions of FASTLOOP_MAX_BYTES_WRITTEN
			 * and FASTLOOP_MAX_BYTES_READ need to be updated if the
			 * number of extra literals decoded here is changed.
			 */
			if (/* enough bits for 2 fast literals + length + offset preload? */
			    CAN_CONSUME_AND_THEN_PRELOAD(2 * LITLEN_TABLEBITS +
							 LENGTH_MAXBITS,
							 OFFSET_TABLEBITS) &&
			    /* enough bits for 2 fast literals + slow literal + litlen preload? */
			    CAN_CONSUME_AND_THEN_PRELOAD(2 * LITLEN_TABLEBITS +
							 DEFLATE_MAX_LITLEN_CODEWORD_LEN,
							 LITLEN_TABLEBITS)) {
				/* 1st extra fast literal */
				lit = entry >> 16;
				entry = d->u.litlen_decode_table[bitbuf & litlen_tablemask];
				saved_bitbuf = bitbuf;
				bitbuf >>= (u8)entry;
				bitsleft -= entry;
				*out_next++ = lit;
				if (entry & HUFFDEC_LITERAL) {
					/* 2nd extra fast literal */
					lit = entry >> 16;
					entry = d->u.litlen_decode_table[bitbuf & litlen_tablemask];
					saved_bitbuf = bitbuf;
					bitbuf >>= (u8)entry;
					bitsleft -= entry;
					*out_next++ = lit;
					if (entry & HUFFDEC_LITERAL) {
						/*
						 * Another fast literal, but
						 * this one is in lieu of the
						 * primary item, so it doesn't
						 * count as one of the extras.
						 */
						lit = entry >> 16;
						entry = d->u.litlen_decode_table[bitbuf & litlen_tablemask];
						REFILL_BITS_IN_FASTLOOP();
						*out_next++ = lit;
						continue;
					}
				}
			} else {
				/*
				 * Decode a literal.  While doing so, preload
				 * the next litlen decode table entry and refill
				 * the bitbuffer.  To reduce latency, we've
				 * arranged for there to be enough "preloadable"
				 * bits remaining to do the table preload
				 * independently of the refill.
				 */
				STATIC_ASSERT(CAN_CONSUME_AND_THEN_PRELOAD(
						LITLEN_TABLEBITS, LITLEN_TABLEBITS));
				lit = entry >> 16;
				entry = d->u.litlen_decode_table[bitbuf & litlen_tablemask];
				REFILL_BITS_IN_FASTLOOP();
				*out_next++ = lit;
				continue;
			}
		}

		/*
		 * It's not a literal entry, so it can be a length entry, a
		 * subtable pointer entry, or an end-of-block entry.  Detect the
		 * two unlikely cases by testing the HUFFDEC_EXCEPTIONAL flag.
		 */
		if (unlikely(entry & HUFFDEC_EXCEPTIONAL)) {
			/* Subtable pointer or end-of-block entry */

			if (unlikely(entry & HUFFDEC_END_OF_BLOCK))
				goto block_done;

			/*
			 * A subtable is required.  Load and consume the
			 * subtable entry.  The subtable entry can be of any
			 * type: literal, length, or end-of-block.
			 */
			entry = d->u.litlen_decode_table[(entry >> 16) +
				EXTRACT_VARBITS(bitbuf, (entry >> 8) & 0x3F)];
			saved_bitbuf = bitbuf;
			bitbuf >>= (u8)entry;
			bitsleft -= entry;

			/*
			 * 32-bit platforms that use the byte-at-a-time refill
			 * method have to do a refill here for there to always
			 * be enough bits to decode a literal that requires a
			 * subtable, then preload the next litlen decode table
			 * entry; or to decode a match length that requires a
			 * subtable, then preload the offset decode table entry.
			 */
			if (!CAN_CONSUME_AND_THEN_PRELOAD(DEFLATE_MAX_LITLEN_CODEWORD_LEN,
							  LITLEN_TABLEBITS) ||
			    !CAN_CONSUME_AND_THEN_PRELOAD(LENGTH_MAXBITS,
							  OFFSET_TABLEBITS))
				REFILL_BITS_IN_FASTLOOP();
			if (entry & HUFFDEC_LITERAL) {
				/* Decode a literal that required a subtable. */
				lit = entry >> 16;
				entry = d->u.litlen_decode_table[bitbuf & litlen_tablemask];
				REFILL_BITS_IN_FASTLOOP();
				*out_next++ = lit;
				continue;
			}
			if (unlikely(entry & HUFFDEC_END_OF_BLOCK))
				goto block_done;
			/* Else, it's a length that required a subtable. */
		}

		/*
		 * Decode the match length: the length base value associated
		 * with the litlen symbol (which we extract from the decode
		 * table entry), plus the extra length bits.  We don't need to
		 * consume the extra length bits here, as they were included in
		 * the bits consumed by the entry earlier.  We also don't need
		 * to check for too-long matches here, as this is inside the
		 * fastloop where it's already been verified that the output
		 * buffer has enough space remaining to copy a max-length match.
		 */
		length = entry >> 16;
		length += EXTRACT_VARBITS8(saved_bitbuf, entry) >> (u8)(entry >> 8);

		/*
		 * Decode the match offset.  There are enough "preloadable" bits
		 * remaining to preload the offset decode table entry, but a
		 * refill might be needed before consuming it.
		 */
		STATIC_ASSERT(CAN_CONSUME_AND_THEN_PRELOAD(LENGTH_MAXFASTBITS,
							   OFFSET_TABLEBITS));
		entry = d->offset_decode_table[bitbuf & BITMASK(OFFSET_TABLEBITS)];
		if (CAN_CONSUME_AND_THEN_PRELOAD(OFFSET_MAXBITS,
						 LITLEN_TABLEBITS)) {
			/*
			 * Decoding a match offset on a 64-bit platform.  We may
			 * need to refill once, but then we can decode the whole
			 * offset and preload the next litlen table entry.
			 */
			if (unlikely(entry & HUFFDEC_EXCEPTIONAL)) {
				/* Offset codeword requires a subtable */
				if (unlikely((u8)bitsleft < OFFSET_MAXBITS +
					     LITLEN_TABLEBITS - PRELOAD_SLACK))
					REFILL_BITS_IN_FASTLOOP();
				bitbuf >>= OFFSET_TABLEBITS;
				bitsleft -= OFFSET_TABLEBITS;
				entry = d->offset_decode_table[(entry >> 16) +
					EXTRACT_VARBITS(bitbuf, (entry >> 8) & 0x3F)];
			} else if (unlikely((u8)bitsleft < OFFSET_MAXFASTBITS +
					    LITLEN_TABLEBITS - PRELOAD_SLACK))
				REFILL_BITS_IN_FASTLOOP();
		} else {
			/* Decoding a match offset on a 32-bit platform */
			REFILL_BITS_IN_FASTLOOP();
			if (unlikely(entry & HUFFDEC_EXCEPTIONAL)) {
				/* Offset codeword requires a subtable */
				bitbuf >>= OFFSET_TABLEBITS;
				bitsleft -= OFFSET_TABLEBITS;
				entry = d->offset_decode_table[(entry >> 16) +
					EXTRACT_VARBITS(bitbuf, (entry >> 8) & 0x3F)];
				REFILL_BITS_IN_FASTLOOP();
				/* No further refill needed before extra bits */
				STATIC_ASSERT(CAN_CONSUME(
					OFFSET_MAXBITS - OFFSET_TABLEBITS));
			} else {
				/* No refill needed before extra bits */
				STATIC_ASSERT(CAN_CONSUME(OFFSET_MAXFASTBITS));
			}
		}
		saved_bitbuf = bitbuf;
		bitbuf >>= (u8)entry;
		bitsleft -= entry; /* optimization: subtract full entry */
		offset = entry >> 16;
		offset += EXTRACT_VARBITS8(saved_bitbuf, entry) >> (u8)(entry >> 8);

		/* Validate the match offset; needed even in the fastloop. */
		SAFETY_CHECK(offset <= out_next - (const u8 *)out);
		src = out_next - offset;
		dst = out_next;
		out_next += length;

		/*
		 * Before starting to issue the instructions to copy the match,
		 * refill the bitbuffer and preload the litlen decode table
		 * entry for the next loop iteration.  This can increase
		 * performance by allowing the latency of the match copy to
		 * overlap with these other operations.  To further reduce
		 * latency, we've arranged for there to be enough bits remaining
		 * to do the table preload independently of the refill, except
		 * on 32-bit platforms using the byte-at-a-time refill method.
		 */
		if (!CAN_CONSUME_AND_THEN_PRELOAD(
			MAX(OFFSET_MAXBITS - OFFSET_TABLEBITS,
			    OFFSET_MAXFASTBITS),
			LITLEN_TABLEBITS) &&
		    unlikely((u8)bitsleft < LITLEN_TABLEBITS - PRELOAD_SLACK))
			REFILL_BITS_IN_FASTLOOP();
		entry = d->u.litlen_decode_table[bitbuf & litlen_tablemask];
		REFILL_BITS_IN_FASTLOOP();

		/*
		 * Copy the match.  On most CPUs the fastest method is a
		 * word-at-a-time copy, unconditionally copying about 5 words
		 * since this is enough for most matches without being too much.
		 *
		 * The normal word-at-a-time copy works for offset >= WORDBYTES,
		 * which is most cases.  The case of offset == 1 is also common
		 * and is worth optimizing for, since it is just RLE encoding of
		 * the previous byte, which is the result of compressing long
		 * runs of the same byte.
		 *
		 * Writing past the match 'length' is allowed here, since it's
		 * been ensured there is enough output space left for a slight
		 * overrun.  FASTLOOP_MAX_BYTES_WRITTEN needs to be updated if
		 * the maximum possible overrun here is changed.
		 */
		if (UNALIGNED_ACCESS_IS_FAST && offset >= WORDBYTES) {
			store_word_unaligned(load_word_unaligned(src), dst);
			src += WORDBYTES;
			dst += WORDBYTES;
			store_word_unaligned(load_word_unaligned(src), dst);
			src += WORDBYTES;
			dst += WORDBYTES;
			store_word_unaligned(load_word_unaligned(src), dst);
			src += WORDBYTES;
			dst += WORDBYTES;
			store_word_unaligned(load_word_unaligned(src), dst);
			src += WORDBYTES;
			dst += WORDBYTES;
			store_word_unaligned(load_word_unaligned(src), dst);
			src += WORDBYTES;
			dst += WORDBYTES;
			while (dst < out_next) {
				store_word_unaligned(load_word_unaligned(src), dst);
				src += WORDBYTES;
				dst += WORDBYTES;
				store_word_unaligned(load_word_unaligned(src), dst);
				src += WORDBYTES;
				dst += WORDBYTES;
				store_word_unaligned(load_word_unaligned(src), dst);
				src += WORDBYTES;
				dst += WORDBYTES;
				store_word_unaligned(load_word_unaligned(src), dst);
				src += WORDBYTES;
				dst += WORDBYTES;
				store_word_unaligned(load_word_unaligned(src), dst);
				src += WORDBYTES;
				dst += WORDBYTES;
			}
		} else if (UNALIGNED_ACCESS_IS_FAST && offset == 1) {
			machine_word_t v;

			/*
			 * This part tends to get auto-vectorized, so keep it
			 * copying a multiple of 16 bytes at a time.
			 */
			v = (machine_word_t)0x0101010101010101 * src[0];
			store_word_unaligned(v, dst);
			dst += WORDBYTES;
			store_word_unaligned(v, dst);
			dst += WORDBYTES;
			store_word_unaligned(v, dst);
			dst += WORDBYTES;
			store_word_unaligned(v, dst);
			dst += WORDBYTES;
			while (dst < out_next) {
				store_word_unaligned(v, dst);
				dst += WORDBYTES;
				store_word_unaligned(v, dst);
				dst += WORDBYTES;
				store_word_unaligned(v, dst);
				dst += WORDBYTES;
				store_word_unaligned(v, dst);
				dst += WORDBYTES;
			}
		} else if (UNALIGNED_ACCESS_IS_FAST) {
			store_word_unaligned(load_word_unaligned(src), dst);
			src += offset;
			dst += offset;
			store_word_unaligned(load_word_unaligned(src), dst);
			src += offset;
			dst += offset;
			do {
				store_word_unaligned(load_word_unaligned(src), dst);
				src += offset;
				dst += offset;
				store_word_unaligned(load_word_unaligned(src), dst);
				src += offset;
				dst += offset;
			} while (dst < out_next);
		} else {
			*dst++ = *src++;
			*dst++ = *src++;
			do {
				*dst++ = *src++;
			} while (dst < out_next);
		}
	} while (in_next < in_fastloop_end && out_next < out_fastloop_end);

	/*
	 * This is the generic loop for decoding literals and matches.  This
	 * handles cases where in_next and out_next are close to the end of
	 * their respective buffers.  Usually this loop isn't performance-
	 * critical, as most time is spent in the fastloop above instead.  We
	 * therefore omit some optimizations here in favor of smaller code.
	 */
generic_loop:
	for (;;) {
		u32 length, offset;
		const u8 *src;
		u8 *dst;

		REFILL_BITS();
		entry = d->u.litlen_decode_table[bitbuf & litlen_tablemask];
		saved_bitbuf = bitbuf;
		bitbuf >>= (u8)entry;
		bitsleft -= entry;
		if (unlikely(entry & HUFFDEC_SUBTABLE_POINTER)) {
			entry = d->u.litlen_decode_table[(entry >> 16) +
					EXTRACT_VARBITS(bitbuf, (entry >> 8) & 0x3F)];
			saved_bitbuf = bitbuf;
			bitbuf >>= (u8)entry;
			bitsleft -= entry;
		}
		length = entry >> 16;
		if (entry & HUFFDEC_LITERAL) {
			if (unlikely(out_next == out_end))
				return LIBDEFLATE_INSUFFICIENT_SPACE;
			*out_next++ = length;
			continue;
		}
		if (unlikely(entry & HUFFDEC_END_OF_BLOCK))
			goto block_done;
		length += EXTRACT_VARBITS8(saved_bitbuf, entry) >> (u8)(entry >> 8);
		if (unlikely(length > out_end - out_next))
			return LIBDEFLATE_INSUFFICIENT_SPACE;

		if (!CAN_CONSUME(LENGTH_MAXBITS + OFFSET_MAXBITS))
			REFILL_BITS();
		entry = d->offset_decode_table[bitbuf & BITMASK(OFFSET_TABLEBITS)];
		if (unlikely(entry & HUFFDEC_EXCEPTIONAL)) {
			bitbuf >>= OFFSET_TABLEBITS;
			bitsleft -= OFFSET_TABLEBITS;
			entry = d->offset_decode_table[(entry >> 16) +
					EXTRACT_VARBITS(bitbuf, (entry >> 8) & 0x3F)];
			if (!CAN_CONSUME(OFFSET_MAXBITS))
				REFILL_BITS();
		}
		offset = entry >> 16;
		offset += EXTRACT_VARBITS8(bitbuf, entry) >> (u8)(entry >> 8);
		bitbuf >>= (u8)entry;
		bitsleft -= entry;

		SAFETY_CHECK(offset <= out_next - (const u8 *)out);
		src = out_next - offset;
		dst = out_next;
		out_next += length;

		STATIC_ASSERT(DEFLATE_MIN_MATCH_LEN == 3);
		*dst++ = *src++;
		*dst++ = *src++;
		do {
			*dst++ = *src++;
		} while (dst < out_next);
	}

block_done:
	/* Finished decoding a block */

	if (!is_final_block)
		goto next_block;

	/* That was the last block. */

	bitsleft = (u8)bitsleft;

	/*
	 * If any of the implicit appended zero bytes were consumed (not just
	 * refilled) before hitting end of stream, then the data is bad.
	 */
	SAFETY_CHECK(overread_count <= (bitsleft >> 3));

	/* Optionally return the actual number of bytes consumed. */
	if (actual_in_nbytes_ret) {
		/* Don't count bytes that were refilled but not consumed. */
		in_next -= (bitsleft >> 3) - overread_count;

		*actual_in_nbytes_ret = in_next - (u8 *)in;
	}

	/* Optionally return the actual number of bytes written. */
	if (actual_out_nbytes_ret) {
		*actual_out_nbytes_ret = out_next - (u8 *)out;
	} else {
		if (out_next != out_end)
			return LIBDEFLATE_SHORT_OUTPUT;
	}
	return LIBDEFLATE_SUCCESS;
}